

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUtilitySourceCommand.cxx
# Opt level: O2

bool __thiscall
cmUtilitySourceCommand::InitialPass
          (cmUtilitySourceCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  cmMakefile *pcVar2;
  cmCacheManager *pcVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  char *__s1;
  cmake *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  cmUtilitySourceCommand *pcVar8;
  allocator local_1d9;
  cmUtilitySourceCommand *local_1d8;
  string utilityExecutable;
  string utilityName;
  string utilityDirectory;
  string cmakeCFGout;
  string cacheEntry;
  string exePath;
  string relativeSource;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string utilitySource;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar4 = cmCommand::Disallowed
                    (&this->super_cmCommand,CMP0034,
                     "The utility_source command should not be called; see CMP0034.");
  if (bVar4) {
    return true;
  }
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x41) {
    std::__cxx11::string::string
              ((string *)&cacheEntry,"called with incorrect number of arguments",
               (allocator *)&utilityName);
    cmCommand::SetError(&this->super_cmCommand,&cacheEntry);
    std::__cxx11::string::~string((string *)&cacheEntry);
    return false;
  }
  std::__cxx11::string::string((string *)&cacheEntry,(string *)pbVar1);
  pcVar6 = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,&cacheEntry);
  pcVar2 = (this->super_cmCommand).Makefile;
  local_1d8 = this;
  std::__cxx11::string::string
            ((string *)&utilityName,"CMAKE_CFG_INTDIR",(allocator *)&relativeSource);
  __s1 = cmMakefile::GetRequiredDefinition(pcVar2,&utilityName);
  std::__cxx11::string::~string((string *)&utilityName);
  pcVar2 = (local_1d8->super_cmCommand).Makefile;
  std::__cxx11::string::string
            ((string *)&utilityName,"CMAKE_CROSSCOMPILING",(allocator *)&relativeSource);
  bVar4 = cmMakefile::IsOn(pcVar2,&utilityName);
  std::__cxx11::string::~string((string *)&utilityName);
  if (bVar4) {
    if (pcVar6 != (char *)0x0) goto LAB_003e3881;
    std::__cxx11::string::string
              ((string *)&utilityName,"UTILITY_SOURCE is used in cross compiling mode for ",
               (allocator *)&relativeSource);
    std::__cxx11::string::append((string *)&utilityName);
    std::__cxx11::string::append((char *)&utilityName);
    cmSystemTools::Message(utilityName._M_dataplus._M_p,"Warning");
    std::__cxx11::string::~string((string *)&utilityName);
  }
  else {
    pcVar7 = cmMakefile::GetCMakeInstance((local_1d8->super_cmCommand).Makefile);
    if (pcVar6 != (char *)0x0) {
      pcVar3 = pcVar7->CacheManager;
      pcVar6 = strstr(pcVar6,"(IntDir)");
      if ((((pcVar6 == (char *)0x0) ||
           ((__s1 != (char *)0x0 && (iVar5 = strcmp(__s1,"$(IntDir)"), iVar5 == 0)))) &&
          (pcVar3->CacheMajorVersion != 0)) && (pcVar3->CacheMinorVersion != 0)) goto LAB_003e3881;
    }
  }
  std::__cxx11::string::string((string *)&utilityName,(string *)(pbVar1 + 1));
  std::__cxx11::string::string((string *)&relativeSource,(string *)(pbVar1 + 2));
  pcVar8 = local_1d8;
  pcVar6 = cmMakefile::GetCurrentSourceDirectory((local_1d8->super_cmCommand).Makefile);
  std::__cxx11::string::string((string *)&utilitySource,pcVar6,(allocator *)&cmakeCFGout);
  std::operator+(&utilityDirectory,&utilitySource,"/");
  std::operator+(&cmakeCFGout,&utilityDirectory,&relativeSource);
  std::__cxx11::string::operator=((string *)&utilitySource,(string *)&cmakeCFGout);
  std::__cxx11::string::~string((string *)&cmakeCFGout);
  std::__cxx11::string::~string((string *)&utilityDirectory);
  bVar4 = cmsys::SystemTools::FileExists(utilitySource._M_dataplus._M_p);
  if (bVar4) {
    __rhs = pbVar1 + 3;
    do {
      if (__rhs == (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish) {
        pcVar2 = (pcVar8->super_cmCommand).Makefile;
        std::__cxx11::string::string
                  ((string *)&utilityDirectory,"CMAKE_CFG_INTDIR",(allocator *)&exePath);
        pcVar6 = cmMakefile::GetRequiredDefinition(pcVar2,&utilityDirectory);
        std::__cxx11::string::string((string *)&cmakeCFGout,pcVar6,(allocator *)&utilityExecutable);
        std::__cxx11::string::~string((string *)&utilityDirectory);
        pcVar6 = cmMakefile::GetCurrentBinaryDirectory((pcVar8->super_cmCommand).Makefile);
        std::__cxx11::string::string((string *)&utilityDirectory,pcVar6,(allocator *)&exePath);
        exePath._M_dataplus._M_p = (pointer)&exePath.field_2;
        exePath._M_string_length = 0;
        exePath.field_2._M_local_buf[0] = '\0';
        pcVar2 = (pcVar8->super_cmCommand).Makefile;
        std::__cxx11::string::string
                  ((string *)&utilityExecutable,"EXECUTABLE_OUTPUT_PATH",(allocator *)&local_f0);
        pcVar6 = cmMakefile::GetDefinition(pcVar2,&utilityExecutable);
        std::__cxx11::string::~string((string *)&utilityExecutable);
        if (pcVar6 != (char *)0x0) {
          pcVar2 = (pcVar8->super_cmCommand).Makefile;
          std::__cxx11::string::string
                    ((string *)&utilityExecutable,"EXECUTABLE_OUTPUT_PATH",(allocator *)&local_f0);
          cmMakefile::GetDefinition(pcVar2,&utilityExecutable);
          std::__cxx11::string::assign((char *)&exePath);
          std::__cxx11::string::~string((string *)&utilityExecutable);
        }
        if (exePath._M_string_length == 0) {
          std::operator+(&utilityExecutable,"/",&relativeSource);
          std::__cxx11::string::append((string *)&utilityDirectory);
          std::__cxx11::string::~string((string *)&utilityExecutable);
        }
        else {
          std::__cxx11::string::_M_assign((string *)&utilityDirectory);
        }
        std::operator+(&local_90,&utilityDirectory,"/");
        std::operator+(&local_70,&local_90,&cmakeCFGout);
        std::operator+(&local_50,&local_70,"/");
        std::operator+(&local_f0,&local_50,&utilityName);
        pcVar2 = (pcVar8->super_cmCommand).Makefile;
        std::__cxx11::string::string((string *)&local_b0,"CMAKE_EXECUTABLE_SUFFIX",&local_1d9);
        pcVar6 = cmMakefile::GetDefinition(pcVar2,&local_b0);
        std::operator+(&utilityExecutable,&local_f0,pcVar6);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
        cmsys::SystemTools::ReplaceString(&utilityExecutable,"/./","/");
        cmMakefile::AddCacheDefinition
                  ((pcVar8->super_cmCommand).Makefile,&cacheEntry,utilityExecutable._M_dataplus._M_p
                   ,"Path to an internal program.",FILEPATH,false);
        cmsys::SystemTools::ConvertToUnixSlashes(&utilityExecutable);
        cmMakefile::AddCacheDefinition
                  ((pcVar8->super_cmCommand).Makefile,&utilityExecutable,
                   utilityName._M_dataplus._M_p,"Executable to project name.",INTERNAL,false);
        std::__cxx11::string::~string((string *)&utilityExecutable);
        std::__cxx11::string::~string((string *)&exePath);
        std::__cxx11::string::~string((string *)&utilityDirectory);
        std::__cxx11::string::~string((string *)&cmakeCFGout);
        break;
      }
      std::operator+(&utilityDirectory,&utilitySource,"/");
      std::operator+(&cmakeCFGout,&utilityDirectory,__rhs);
      std::__cxx11::string::~string((string *)&utilityDirectory);
      bVar4 = cmsys::SystemTools::FileExists(cmakeCFGout._M_dataplus._M_p);
      __rhs = __rhs + 1;
      std::__cxx11::string::~string((string *)&cmakeCFGout);
      pcVar8 = local_1d8;
    } while (bVar4);
  }
  std::__cxx11::string::~string((string *)&utilitySource);
  std::__cxx11::string::~string((string *)&relativeSource);
  std::__cxx11::string::~string((string *)&utilityName);
LAB_003e3881:
  std::__cxx11::string::~string((string *)&cacheEntry);
  return true;
}

Assistant:

bool cmUtilitySourceCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(this->Disallowed(cmPolicies::CMP0034,
      "The utility_source command should not be called; see CMP0034."))
    { return true; }
  if(args.size() < 3)
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  std::vector<std::string>::const_iterator arg = args.begin();

  // The first argument is the cache entry name.
  std::string cacheEntry = *arg++;
  const char* cacheValue =
    this->Makefile->GetDefinition(cacheEntry);
  // If it exists already and appears up to date then we are done.  If
  // the string contains "(IntDir)" but that is not the
  // CMAKE_CFG_INTDIR setting then the value is out of date.
  const char* intDir =
    this->Makefile->GetRequiredDefinition("CMAKE_CFG_INTDIR");

  bool haveCacheValue = false;
  if (this->Makefile->IsOn("CMAKE_CROSSCOMPILING"))
    {
    haveCacheValue = (cacheValue != 0);
    if (!haveCacheValue)
      {
      std::string msg = "UTILITY_SOURCE is used in cross compiling mode for ";
      msg += cacheEntry;
      msg += ". If your intention is to run this executable, you need to "
            "preload the cache with the full path to a version of that "
            "program, which runs on this build machine.";
      cmSystemTools::Message(msg.c_str() ,"Warning");
      }
    }
  else
    {
    cmCacheManager *manager =
        this->Makefile->GetCMakeInstance()->GetCacheManager();
    haveCacheValue = (cacheValue &&
     (strstr(cacheValue, "(IntDir)") == 0 ||
      (intDir && strcmp(intDir, "$(IntDir)") == 0)) &&
     (manager->GetCacheMajorVersion() != 0 &&
      manager->GetCacheMinorVersion() != 0 ));
    }

  if(haveCacheValue)
    {
    return true;
    }

  // The second argument is the utility's executable name, which will be
  // needed later.
  std::string utilityName = *arg++;

  // The third argument specifies the relative directory of the source
  // of the utility.
  std::string relativeSource = *arg++;
  std::string utilitySource = this->Makefile->GetCurrentSourceDirectory();
  utilitySource = utilitySource+"/"+relativeSource;

  // If the directory doesn't exist, the source has not been included.
  if(!cmSystemTools::FileExists(utilitySource.c_str()))
    { return true; }

  // Make sure all the files exist in the source directory.
  while(arg != args.end())
    {
    std::string file = utilitySource+"/"+*arg++;
    if(!cmSystemTools::FileExists(file.c_str()))
      { return true; }
    }

  // The source exists.
  std::string cmakeCFGout =
    this->Makefile->GetRequiredDefinition("CMAKE_CFG_INTDIR");
  std::string utilityDirectory = this->Makefile->GetCurrentBinaryDirectory();
  std::string exePath;
  if (this->Makefile->GetDefinition("EXECUTABLE_OUTPUT_PATH"))
    {
    exePath = this->Makefile->GetDefinition("EXECUTABLE_OUTPUT_PATH");
    }
  if(!exePath.empty())
    {
    utilityDirectory = exePath;
    }
  else
    {
    utilityDirectory += "/"+relativeSource;
    }

  // Construct the cache entry for the executable's location.
  std::string utilityExecutable =
    utilityDirectory+"/"+cmakeCFGout+"/"
    +utilityName+this->Makefile->GetDefinition("CMAKE_EXECUTABLE_SUFFIX");

  // make sure we remove any /./ in the name
  cmSystemTools::ReplaceString(utilityExecutable, "/./", "/");

  // Enter the value into the cache.
  this->Makefile->AddCacheDefinition(cacheEntry,
                                 utilityExecutable.c_str(),
                                 "Path to an internal program.",
                                 cmState::FILEPATH);
  // add a value into the cache that maps from the
  // full path to the name of the project
  cmSystemTools::ConvertToUnixSlashes(utilityExecutable);
  this->Makefile->AddCacheDefinition(utilityExecutable,
                                 utilityName.c_str(),
                                 "Executable to project name.",
                                 cmState::INTERNAL);

  return true;
}